

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

float Abc_SclCountNonBufferDelay(SC_Man *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  float Delay;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  local_24 = 0.0;
  for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_28 < iVar1; local_28 = local_28 + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_28);
    fVar2 = Abc_SclCountNonBufferDelayInt(p,pObj_00);
    local_24 = fVar2 + local_24;
  }
  return local_24;
}

Assistant:

float Abc_SclCountNonBufferDelay( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Delay = 0;
    int i; 
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Delay += Abc_SclCountNonBufferDelayInt( p, pFanout );
    return Delay;
}